

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::checkEnumerationRequiredNotation
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,XMLCh *type)

{
  bool bVar1;
  XMLCh *pXVar2;
  
  pXVar2 = getLocalPart(this,type);
  bVar1 = XMLString::equals(pXVar2,(XMLCh *)XMLUni::fgNotationString);
  if (bVar1) {
    pXVar2 = getPrefix(this,type);
    pXVar2 = resolvePrefixToURI(this,elem,pXVar2);
    bVar1 = XMLString::equals(pXVar2,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (bVar1) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x5d,name,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  return;
}

Assistant:

void TraverseSchema::checkEnumerationRequiredNotation(const DOMElement* const elem,
                                                      const XMLCh* const name,
                                                      const XMLCh* const type) {

    const XMLCh* localPart = getLocalPart(type);

    if (XMLString::equals(localPart, XMLUni::fgNotationString)) {
        const XMLCh* prefix = getPrefix(type);
        const XMLCh* typeURI = resolvePrefixToURI(elem, prefix);

        if (XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNotationType, name);
        }
    }
}